

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  pointer pbVar3;
  pointer pcVar4;
  bool bVar5;
  string *psVar6;
  char *pcVar7;
  string *psVar8;
  cmCustomCommand *pcVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar11;
  pointer pbVar12;
  string *output;
  pointer ppcVar13;
  pointer ppcVar14;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  string currentBinDir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  string local_78;
  string *local_58;
  pointer local_50;
  cmListFileBacktrace local_48;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)&headerSources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&headerSources,"CMAKE_BUILD_TYPE","");
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&headerSources);
  if (headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&headerSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)headerSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)&headerSources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&headerSources,"ADDITIONAL_MAKE_CLEAN_FILES","");
  pcVar7 = cmMakefile::GetProperty(pcVar1,(string *)&headerSources);
  if (headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&headerSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)headerSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (pcVar7 != (char *)0x0) {
    local_48.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&currentBinDir,&local_48);
    if (local_48.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&extraSources,(char *)&currentBinDir);
    headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&headerSources.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)headerSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    psVar8 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        extraSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (cmLocalGenerator *)this->LocalGenerator,psVar6,false,
                        (this->super_cmCommonTargetGenerator).GeneratorTarget,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)&headerSources);
    cmSystemTools::ExpandListArgument(psVar8,&this->CleanFiles,false);
    if (headerSources.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&headerSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(headerSources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)headerSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&extraSources);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&currentBinDir);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)&headerSources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&headerSources,"CLEAN_NO_CUSTOM","");
  pcVar7 = cmMakefile::GetProperty(pcVar1,(string *)&headerSources);
  if (headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&headerSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)headerSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  bVar5 = cmSystemTools::IsOff(pcVar7);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&customCommands,psVar6);
  local_58 = psVar6;
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)this->LocalGenerator);
  currentBinDir._M_dataplus._M_p = (pointer)&currentBinDir.field_2;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&currentBinDir,pcVar2,pcVar2 + psVar6->_M_string_length);
  local_50 = customCommands.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppcVar13 = customCommands.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar9 = cmSourceFile::GetCustomCommand(*ppcVar13);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      pcVar2 = (this->super_cmCommonTargetGenerator).ConfigName._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar2,
                 pcVar2 + (this->super_cmCommonTargetGenerator).ConfigName._M_string_length);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&headerSources,pcVar9,&local_78,
                 (cmLocalGenerator *)this->LocalGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      GenerateCustomRuleFile(this,(cmCustomCommandGenerator *)&headerSources);
      if (bVar5) {
        pvVar10 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                            ((cmCustomCommandGenerator *)&headerSources);
        pbVar3 = (pvVar10->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = (pvVar10->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
            pbVar12 = pbVar12 + 1) {
          cmLocalGenerator::MaybeConvertToRelativePath
                    ((string *)&extraSources,(cmLocalGenerator *)this->LocalGenerator,&currentBinDir
                     ,pbVar12);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CleanFiles,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &extraSources);
          if (extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (pointer)&extraSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(extraSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)extraSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
        }
        pvVar10 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                            ((cmCustomCommandGenerator *)&headerSources);
        pbVar3 = (pvVar10->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = (pvVar10->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
            pbVar12 = pbVar12 + 1) {
          cmLocalGenerator::MaybeConvertToRelativePath
                    ((string *)&extraSources,(cmLocalGenerator *)this->LocalGenerator,&currentBinDir
                     ,pbVar12);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CleanFiles,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &extraSources);
          if (extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (pointer)&extraSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(extraSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)extraSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
        }
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&headerSources);
      ppcVar13 = ppcVar13 + 1;
    } while (ppcVar13 != local_50);
  }
  if (bVar5) {
    pvVar11 = cmGeneratorTarget::GetPreBuildCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&extraSources,pvVar11);
    ppcVar13 = extraSources.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    pvVar11 = cmGeneratorTarget::GetPreLinkCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    pcVar4 = (pvVar11->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pvVar11 = cmGeneratorTarget::GetPreLinkCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)&extraSources,ppcVar13,
               pcVar4,(pvVar11->
                      super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl
                      .super__Vector_impl_data._M_finish);
    ppcVar13 = extraSources.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    pvVar11 = cmGeneratorTarget::GetPostBuildCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    pcVar4 = (pvVar11->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pvVar11 = cmGeneratorTarget::GetPostBuildCommands
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)&extraSources,ppcVar13,
               pcVar4,(pvVar11->
                      super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl
                      .super__Vector_impl_data._M_finish);
    if (extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar9 = (cmCustomCommand *)
               extraSources.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        pvVar10 = cmCustomCommand::GetByproducts_abi_cxx11_(pcVar9);
        pbVar3 = (pvVar10->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = (pvVar10->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar3;
            pbVar12 = pbVar12 + 1) {
          cmLocalGenerator::MaybeConvertToRelativePath
                    ((string *)&headerSources,(cmLocalGenerator *)this->LocalGenerator,
                     &currentBinDir,pbVar12);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CleanFiles,(string *)&headerSources);
          if (headerSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (pointer)&headerSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(headerSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)headerSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
        }
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != (cmCustomCommand *)
                         extraSources.
                         super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::~vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&extraSources);
  }
  psVar6 = local_58;
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&headerSources,local_58);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,&headerSources,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&extraSources,psVar6);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,&extraSources,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  externalObjects.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  externalObjects.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  externalObjects.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetExternalObjects
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&externalObjects,psVar6);
  ppcVar13 = externalObjects.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar14 = externalObjects.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      psVar8 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar14);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->ExternalObjects,psVar8);
      ppcVar14 = ppcVar14 + 1;
    } while (ppcVar14 != ppcVar13);
  }
  objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,&objectSources,psVar6);
  ppcVar14 = objectSources.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  for (ppcVar13 = objectSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar13 != ppcVar14;
      ppcVar13 = ppcVar13 + 1) {
    WriteObjectRuleFiles(this,*ppcVar13);
  }
  if (objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(objectSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)objectSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)objectSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (externalObjects.
      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(externalObjects.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)externalObjects.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)externalObjects.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (extraSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(extraSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)extraSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)extraSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (headerSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)headerSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)headerSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)currentBinDir._M_dataplus._M_p != &currentBinDir.field_2) {
    operator_delete(currentBinDir._M_dataplus._M_p,currentBinDir.field_2._M_allocated_capacity + 1);
  }
  if (customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(customCommands.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)customCommands.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)customCommands.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // write the custom commands for this target
  // Look for files registered for cleaning in this directory.
  if (const char* additional_clean_files =
        this->Makefile->GetProperty("ADDITIONAL_MAKE_CLEAN_FILES")) {
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(additional_clean_files);

    cmSystemTools::ExpandListArgument(
      cge->Evaluate(this->LocalGenerator, config, false, this->GeneratorTarget,
                    nullptr, nullptr),
      this->CleanFiles);
  }

  // add custom commands to the clean rules?
  const char* clean_no_custom = this->Makefile->GetProperty("CLEAN_NO_CUSTOM");
  bool clean = cmSystemTools::IsOff(clean_no_custom);

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands, config);
  std::string currentBinDir =
    this->LocalGenerator->GetCurrentBinaryDirectory();
  for (cmSourceFile const* sf : customCommands) {
    cmCustomCommandGenerator ccg(*sf->GetCustomCommand(), this->ConfigName,
                                 this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean) {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for (std::string const& output : outputs) {
        this->CleanFiles.push_back(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           output));
      }
      const std::vector<std::string>& byproducts = ccg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.push_back(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           byproduct));
      }
    }
  }

  // Add byproducts from build events to the clean rules
  if (clean) {
    std::vector<cmCustomCommand> buildEventCommands =
      this->GeneratorTarget->GetPreBuildCommands();

    buildEventCommands.insert(
      buildEventCommands.end(),
      this->GeneratorTarget->GetPreLinkCommands().begin(),
      this->GeneratorTarget->GetPreLinkCommands().end());
    buildEventCommands.insert(
      buildEventCommands.end(),
      this->GeneratorTarget->GetPostBuildCommands().begin(),
      this->GeneratorTarget->GetPostBuildCommands().end());

    for (const auto& be : buildEventCommands) {
      const std::vector<std::string>& byproducts = be.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.push_back(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           byproduct));
      }
    }
  }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources, this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources, this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects, config);
  for (cmSourceFile const* sf : externalObjects) {
    this->ExternalObjects.push_back(sf->GetFullPath());
  }
  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources, config);
  for (cmSourceFile const* sf : objectSources) {
    // Generate this object file's rule file.
    this->WriteObjectRuleFiles(*sf);
  }
}